

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

void __thiscall
TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_Test::testBody
          (TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_Test *this)

{
  int iVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 in_stack_fffffffffffff308;
  int iVar7;
  undefined8 uVar5;
  NormalTestTerminator *pNVar6;
  NormalTestTerminator local_620;
  NormalTestTerminator local_618;
  pair<int,_int> local_610;
  SimpleString local_608;
  SimpleString local_600;
  pair<int,_int> local_5f8;
  pair<int,_int> local_5f0;
  pair<int,_int> local_5e8;
  NormalTestTerminator local_5e0;
  NormalTestTerminator local_5d8;
  pair<int,_int> local_5d0;
  SimpleString local_5c8;
  SimpleString local_5c0;
  pair<int,_int> local_5b8;
  pair<int,_int> local_5b0;
  pair<int,_int> local_5a8;
  NormalTestTerminator local_5a0;
  NormalTestTerminator local_598;
  pair<int,_int> local_590;
  SimpleString local_588;
  SimpleString local_580;
  pair<int,_int> local_578;
  pair<int,_int> local_570;
  pair<int,_int> local_568;
  NormalTestTerminator local_560;
  NormalTestTerminator local_558;
  pair<int,_int> local_550;
  SimpleString local_548;
  SimpleString local_540;
  pair<int,_int> local_538;
  pair<int,_int> local_530;
  pair<int,_int> local_528;
  NormalTestTerminator local_520;
  NormalTestTerminator local_518;
  pair<int,_int> local_510;
  SimpleString local_508;
  SimpleString local_500;
  pair<int,_int> local_4f8;
  pair<int,_int> local_4f0;
  pair<int,_int> local_4e8;
  NormalTestTerminator local_4e0;
  NormalTestTerminator local_4d8;
  pair<int,_int> local_4d0;
  SimpleString local_4c8;
  SimpleString local_4c0;
  pair<int,_int> local_4b8;
  pair<int,_int> local_4b0;
  pair<int,_int> local_4a8;
  NormalTestTerminator local_4a0;
  NormalTestTerminator local_498;
  pair<int,_int> local_490;
  SimpleString local_488;
  SimpleString local_480;
  pair<int,_int> local_478;
  pair<int,_int> local_470;
  pair<int,_int> local_468;
  NormalTestTerminator local_460;
  NormalTestTerminator local_458;
  pair<int,_int> local_450;
  SimpleString local_448;
  SimpleString local_440;
  pair<int,_int> local_438;
  pair<int,_int> local_430;
  pair<int,_int> local_428;
  NormalTestTerminator local_420;
  NormalTestTerminator local_418;
  pair<int,_int> local_410;
  SimpleString local_408;
  SimpleString local_400;
  pair<int,_int> local_3f8;
  pair<int,_int> local_3f0;
  pair<int,_int> local_3e8;
  NormalTestTerminator local_3e0;
  NormalTestTerminator local_3d8;
  pair<int,_int> local_3d0;
  SimpleString local_3c8;
  SimpleString local_3c0;
  pair<int,_int> local_3b8;
  pair<int,_int> local_3b0;
  pair<int,_int> local_3a8;
  NormalTestTerminator local_3a0;
  NormalTestTerminator local_398;
  pair<int,_int> local_390;
  SimpleString local_388;
  SimpleString local_380;
  pair<int,_int> local_378;
  pair<int,_int> local_370;
  pair<int,_int> local_368;
  NormalTestTerminator local_360;
  NormalTestTerminator local_358;
  pair<int,_int> local_350;
  SimpleString local_348;
  SimpleString local_340;
  pair<int,_int> local_338;
  pair<int,_int> local_330;
  pair<int,_int> local_328;
  NormalTestTerminator local_320;
  NormalTestTerminator local_318;
  pair<int,_int> local_310;
  SimpleString local_308;
  SimpleString local_300;
  pair<int,_int> local_2f8;
  pair<int,_int> local_2f0;
  pair<int,_int> local_2e8;
  NormalTestTerminator local_2e0;
  NormalTestTerminator local_2d8;
  pair<int,_int> local_2d0;
  SimpleString local_2c8;
  SimpleString local_2c0;
  pair<int,_int> local_2b8;
  pair<int,_int> local_2b0;
  pair<int,_int> local_2a8;
  NormalTestTerminator local_2a0;
  NormalTestTerminator local_298;
  pair<int,_int> local_290;
  SimpleString local_288;
  SimpleString local_280;
  pair<int,_int> local_278;
  pair<int,_int> local_270;
  pair<int,_int> local_268;
  NormalTestTerminator local_260;
  NormalTestTerminator local_258;
  pair<int,_int> local_250;
  SimpleString local_248;
  SimpleString local_240;
  pair<int,_int> local_238;
  pair<int,_int> local_230;
  pair<int,_int> local_228;
  NormalTestTerminator local_220;
  NormalTestTerminator local_218;
  pair<int,_int> local_210;
  SimpleString local_208;
  SimpleString local_200;
  pair<int,_int> local_1f8;
  pair<int,_int> local_1f0;
  pair<int,_int> local_1e8;
  NormalTestTerminator local_1e0;
  NormalTestTerminator local_1d8;
  pair<int,_int> local_1d0;
  SimpleString local_1c8;
  SimpleString local_1c0;
  pair<int,_int> local_1b8;
  pair<int,_int> local_1b0;
  pair<int,_int> local_1a8;
  NormalTestTerminator local_1a0;
  NormalTestTerminator local_198;
  pair<int,_int> local_190;
  SimpleString local_188;
  SimpleString local_180;
  pair<int,_int> local_178;
  pair<int,_int> local_170;
  pair<int,_int> local_168;
  NormalTestTerminator local_160;
  NormalTestTerminator local_158;
  pair<int,_int> local_150;
  SimpleString local_148;
  SimpleString local_140;
  pair<int,_int> local_138;
  pair<int,_int> local_130;
  pair<int,_int> local_128;
  NormalTestTerminator local_120;
  NormalTestTerminator local_118;
  pair<int,_int> local_110;
  SimpleString local_108;
  SimpleString local_100;
  pair<int,_int> local_f8;
  pair<int,_int> local_f0;
  pair<int,_int> local_e8;
  NormalTestTerminator local_e0;
  NormalTestTerminator local_d8;
  pair<int,_int> local_d0;
  SimpleString local_c8;
  SimpleString local_c0;
  pair<int,_int> local_b8;
  pair<int,_int> local_b0;
  pair<int,_int> local_a8;
  NormalTestTerminator local_a0;
  NormalTestTerminator local_98;
  pair<int,_int> local_90;
  SimpleString local_88;
  SimpleString local_80;
  pair<int,_int> local_78;
  pair<int,_int> local_70;
  pair<int,_int> local_68;
  NormalTestTerminator local_60;
  NormalTestTerminator local_58;
  pair<int,_int> local_50;
  SimpleString local_48 [3];
  SimpleString local_30;
  pair<int,_int> local_28;
  pair<int,_int> local_20;
  pair<int,_int> local_18;
  TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_Test *local_10;
  TEST_ScoringTableTest_NonDealerSelfDrawn_ManganOrMore_Test *this_local;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff308 >> 0x20);
  local_10 = this;
  local_18 = mahjong::ScoringTable::nonDealerSelfDrawn
                       ((ScoringTable *)
                        &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
  if (local_18.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_60.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_60;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc0);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d93d3);
  }
  else {
    local_20 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
    iVar1 = local_20.first;
    local_28 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
    if (iVar1 != local_28.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc0);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_30);
    local_50 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(local_48);
    local_58.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_58);
    uVar5 = CONCAT44(iVar7,0xc0);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_58);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d9313);
    SimpleString::~SimpleString((SimpleString *)0x1d931c);
    SimpleString::~SimpleString((SimpleString *)0x1d9325);
  }
  local_68 = mahjong::ScoringTable::nonDealerSelfDrawn
                       ((ScoringTable *)
                        &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
  if (local_68.second == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_a0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc1);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d965a);
  }
  else {
    local_70 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
    iVar1 = local_70.second;
    local_78 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
    if (iVar1 != local_78.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc1);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_80);
    local_90 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x46);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_88);
    local_98.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_98);
    uVar5 = CONCAT44(iVar7,0xc1);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_98);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d958e);
    SimpleString::~SimpleString((SimpleString *)0x1d9597);
    SimpleString::~SimpleString((SimpleString *)0x1d95a0);
  }
  local_a8 = mahjong::ScoringTable::nonDealerSelfDrawn
                       ((ScoringTable *)
                        &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
  if (local_a8.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_e0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc2);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d990b);
  }
  else {
    local_b0 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
    iVar1 = local_b0.first;
    local_b8 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
    if (iVar1 != local_b8.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc2);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_c0);
    local_d0 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_d8);
    uVar5 = CONCAT44(iVar7,0xc2);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_d8);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d9833);
    SimpleString::~SimpleString((SimpleString *)0x1d983f);
    SimpleString::~SimpleString((SimpleString *)0x1d984b);
  }
  local_e8 = mahjong::ScoringTable::nonDealerSelfDrawn
                       ((ScoringTable *)
                        &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
  if (local_e8.second == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_120.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_120;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc3);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d9bbc);
  }
  else {
    local_f0 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
    iVar1 = local_f0.second;
    local_f8 = mahjong::ScoringTable::nonDealerSelfDrawn
                         ((ScoringTable *)
                          &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28);
    if (iVar1 != local_f8.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc3);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_100);
    local_110 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x28)
    ;
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_108);
    local_118.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_118);
    uVar5 = CONCAT44(iVar7,0xc3);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_118);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d9ae4);
    SimpleString::~SimpleString((SimpleString *)0x1d9af0);
    SimpleString::~SimpleString((SimpleString *)0x1d9afc);
  }
  local_128 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46);
  if (local_128.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_160.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_160;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc4);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d9e6d);
  }
  else {
    local_130 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46)
    ;
    iVar1 = local_130.first;
    local_138 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46)
    ;
    if (iVar1 != local_138.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc4);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_140);
    local_150 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46)
    ;
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_148);
    local_158.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_158);
    uVar5 = CONCAT44(iVar7,0xc4);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_158);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1d9d95);
    SimpleString::~SimpleString((SimpleString *)0x1d9da1);
    SimpleString::~SimpleString((SimpleString *)0x1d9dad);
  }
  local_168 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46);
  if (local_168.second == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_1a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_1a0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc5);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da11e);
  }
  else {
    local_170 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46)
    ;
    iVar1 = local_170.second;
    local_178 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46)
    ;
    if (iVar1 != local_178.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc5);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_180);
    local_190 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x46)
    ;
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_188);
    local_198.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_198);
    uVar5 = CONCAT44(iVar7,0xc5);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_198);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da046);
    SimpleString::~SimpleString((SimpleString *)0x1da052);
    SimpleString::~SimpleString((SimpleString *)0x1da05e);
  }
  local_1a8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
  if (local_1a8.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_1e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_1e0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc6);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da3c3);
  }
  else {
    local_1b0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
    iVar1 = local_1b0.first;
    local_1b8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
    if (iVar1 != local_1b8.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc6);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_1c0);
    local_1d0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_1c8);
    local_1d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1d8);
    uVar5 = CONCAT44(iVar7,0xc6);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_1d8);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da2eb);
    SimpleString::~SimpleString((SimpleString *)0x1da2f7);
    SimpleString::~SimpleString((SimpleString *)0x1da303);
  }
  local_1e8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
  if (local_1e8.second == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_220.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_220;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,199);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da668);
  }
  else {
    local_1f0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
    iVar1 = local_1f0.second;
    local_1f8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
    if (iVar1 != local_1f8.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,199);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_200);
    local_210 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,5,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_208);
    local_218.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_218);
    uVar5 = CONCAT44(iVar7,199);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_218);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da590);
    SimpleString::~SimpleString((SimpleString *)0x1da59c);
    SimpleString::~SimpleString((SimpleString *)0x1da5a8);
  }
  local_228 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
  if (local_228.first == 3000) {
    pUVar2 = UtestShell::getCurrent();
    local_260.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_260;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xc9);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da90d);
  }
  else {
    local_230 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
    iVar1 = local_230.first;
    local_238 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
    if (iVar1 != local_238.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xc9);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_240);
    local_250 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_248);
    local_258.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_258);
    uVar5 = CONCAT44(iVar7,0xc9);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_258);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1da835);
    SimpleString::~SimpleString((SimpleString *)0x1da841);
    SimpleString::~SimpleString((SimpleString *)0x1da84d);
  }
  local_268 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
  if (local_268.second == 6000) {
    pUVar2 = UtestShell::getCurrent();
    local_2a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_2a0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xca);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dabb2);
  }
  else {
    local_270 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
    iVar1 = local_270.second;
    local_278 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
    if (iVar1 != local_278.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xca);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_280);
    local_290 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,6,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_288);
    local_298.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_298);
    uVar5 = CONCAT44(iVar7,0xca);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_298);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1daada);
    SimpleString::~SimpleString((SimpleString *)0x1daae6);
    SimpleString::~SimpleString((SimpleString *)0x1daaf2);
  }
  local_2a8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
  if (local_2a8.first == 3000) {
    pUVar2 = UtestShell::getCurrent();
    local_2e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_2e0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcb);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dae57);
  }
  else {
    local_2b0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
    iVar1 = local_2b0.first;
    local_2b8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
    if (iVar1 != local_2b8.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xcb);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_2c0);
    local_2d0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_2c8);
    local_2d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_2d8);
    uVar5 = CONCAT44(iVar7,0xcb);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_2d8);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dad7f);
    SimpleString::~SimpleString((SimpleString *)0x1dad8b);
    SimpleString::~SimpleString((SimpleString *)0x1dad97);
  }
  local_2e8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
  if (local_2e8.second == 6000) {
    pUVar2 = UtestShell::getCurrent();
    local_320.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_320;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcc);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db0fc);
  }
  else {
    local_2f0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
    iVar1 = local_2f0.second;
    local_2f8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
    if (iVar1 != local_2f8.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xcc);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_300);
    local_310 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,7,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_308);
    local_318.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_318);
    uVar5 = CONCAT44(iVar7,0xcc);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_318);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db024);
    SimpleString::~SimpleString((SimpleString *)0x1db030);
    SimpleString::~SimpleString((SimpleString *)0x1db03c);
  }
  local_328 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
  if (local_328.first == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_360.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_360;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xce);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db3a1);
  }
  else {
    local_330 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
    iVar1 = local_330.first;
    local_338 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
    if (iVar1 != local_338.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xce);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_340);
    local_350 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_348);
    local_358.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_358);
    uVar5 = CONCAT44(iVar7,0xce);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_358);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db2c9);
    SimpleString::~SimpleString((SimpleString *)0x1db2d5);
    SimpleString::~SimpleString((SimpleString *)0x1db2e1);
  }
  local_368 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
  if (local_368.second == 8000) {
    pUVar2 = UtestShell::getCurrent();
    local_3a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_3a0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xcf);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db646);
  }
  else {
    local_370 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
    iVar1 = local_370.second;
    local_378 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
    if (iVar1 != local_378.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xcf);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_380);
    local_390 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,8,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_388);
    local_398.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_398);
    uVar5 = CONCAT44(iVar7,0xcf);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_398);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db56e);
    SimpleString::~SimpleString((SimpleString *)0x1db57a);
    SimpleString::~SimpleString((SimpleString *)0x1db586);
  }
  local_3a8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
  if (local_3a8.first == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_3e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_3e0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd0);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db8eb);
  }
  else {
    local_3b0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
    iVar1 = local_3b0.first;
    local_3b8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
    if (iVar1 != local_3b8.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd0);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_3c0);
    local_3d0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_3c8);
    local_3d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_3d8);
    uVar5 = CONCAT44(iVar7,0xd0);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_3d8);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1db813);
    SimpleString::~SimpleString((SimpleString *)0x1db81f);
    SimpleString::~SimpleString((SimpleString *)0x1db82b);
  }
  local_3e8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
  if (local_3e8.second == 8000) {
    pUVar2 = UtestShell::getCurrent();
    local_420.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_420;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd1);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dbb90);
  }
  else {
    local_3f0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
    iVar1 = local_3f0.second;
    local_3f8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
    if (iVar1 != local_3f8.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd1);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_400);
    local_410 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,9,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_408);
    local_418.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_418);
    uVar5 = CONCAT44(iVar7,0xd1);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_418);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dbab8);
    SimpleString::~SimpleString((SimpleString *)0x1dbac4);
    SimpleString::~SimpleString((SimpleString *)0x1dbad0);
  }
  local_428 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
  if (local_428.first == 4000) {
    pUVar2 = UtestShell::getCurrent();
    local_460.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_460;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd2);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dbe35);
  }
  else {
    local_430 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
    iVar1 = local_430.first;
    local_438 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
    if (iVar1 != local_438.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd2);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_440);
    local_450 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_448);
    local_458.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_458);
    uVar5 = CONCAT44(iVar7,0xd2);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_458);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dbd5d);
    SimpleString::~SimpleString((SimpleString *)0x1dbd69);
    SimpleString::~SimpleString((SimpleString *)0x1dbd75);
  }
  local_468 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
  if (local_468.second == 8000) {
    pUVar2 = UtestShell::getCurrent();
    local_4a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_4a0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd3);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc0da);
  }
  else {
    local_470 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
    iVar1 = local_470.second;
    local_478 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
    if (iVar1 != local_478.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd3);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_480);
    local_490 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,10,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_488);
    local_498.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_498);
    uVar5 = CONCAT44(iVar7,0xd3);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_498);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc002);
    SimpleString::~SimpleString((SimpleString *)0x1dc00e);
    SimpleString::~SimpleString((SimpleString *)0x1dc01a);
  }
  local_4a8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
  if (local_4a8.first == 6000) {
    pUVar2 = UtestShell::getCurrent();
    local_4e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_4e0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd5);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc37f);
  }
  else {
    local_4b0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
    iVar1 = local_4b0.first;
    local_4b8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
    if (iVar1 != local_4b8.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd5);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_4c0);
    local_4d0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_4c8);
    local_4d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_4d8);
    uVar5 = CONCAT44(iVar7,0xd5);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_4d8);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc2a7);
    SimpleString::~SimpleString((SimpleString *)0x1dc2b3);
    SimpleString::~SimpleString((SimpleString *)0x1dc2bf);
  }
  local_4e8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
  if (local_4e8.second == 12000) {
    pUVar2 = UtestShell::getCurrent();
    local_520.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_520;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd6);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc624);
  }
  else {
    local_4f0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
    iVar1 = local_4f0.second;
    local_4f8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
    if (iVar1 != local_4f8.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd6);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_500);
    local_510 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xb,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_508);
    local_518.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_518);
    uVar5 = CONCAT44(iVar7,0xd6);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_518);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc54c);
    SimpleString::~SimpleString((SimpleString *)0x1dc558);
    SimpleString::~SimpleString((SimpleString *)0x1dc564);
  }
  local_528 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
  if (local_528.first == 6000) {
    pUVar2 = UtestShell::getCurrent();
    local_560.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_560;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd7);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc8c9);
  }
  else {
    local_530 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
    iVar1 = local_530.first;
    local_538 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
    if (iVar1 != local_538.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd7);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_540);
    local_550 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_548);
    local_558.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_558);
    uVar5 = CONCAT44(iVar7,0xd7);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_558);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dc7f1);
    SimpleString::~SimpleString((SimpleString *)0x1dc7fd);
    SimpleString::~SimpleString((SimpleString *)0x1dc809);
  }
  local_568 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
  if (local_568.second == 12000) {
    pUVar2 = UtestShell::getCurrent();
    local_5a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_5a0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xd8);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dcb6e);
  }
  else {
    local_570 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
    iVar1 = local_570.second;
    local_578 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
    if (iVar1 != local_578.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xd8);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_580);
    local_590 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xc,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_588);
    local_598.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_598);
    uVar5 = CONCAT44(iVar7,0xd8);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_598);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dca96);
    SimpleString::~SimpleString((SimpleString *)0x1dcaa2);
    SimpleString::~SimpleString((SimpleString *)0x1dcaae);
  }
  local_5a8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
  if (local_5a8.first == 8000) {
    pUVar2 = UtestShell::getCurrent();
    local_5e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar6 = &local_5e0;
    NormalTestTerminator::NormalTestTerminator(pNVar6);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xda);
    iVar7 = (int)((ulong)pNVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dce13);
  }
  else {
    local_5b0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
    iVar1 = local_5b0.first;
    local_5b8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
    if (iVar1 != local_5b8.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xda);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_5c0);
    local_5d0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_5c8);
    local_5d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_5d8);
    uVar5 = CONCAT44(iVar7,0xda);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar5,&local_5d8);
    iVar7 = (int)((ulong)uVar5 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dcd3b);
    SimpleString::~SimpleString((SimpleString *)0x1dcd47);
    SimpleString::~SimpleString((SimpleString *)0x1dcd53);
  }
  local_5e8 = mahjong::ScoringTable::nonDealerSelfDrawn
                        ((ScoringTable *)
                         &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
  if (local_5e8.second == 16000) {
    pUVar2 = UtestShell::getCurrent();
    local_620.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_620);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0xdb,&local_620);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dd0b8);
  }
  else {
    local_5f0 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
    iVar1 = local_5f0.second;
    local_5f8 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
    if (iVar1 != local_5f8.second) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0xdb);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(iVar7);
    pcVar3 = SimpleString::asCharString(&local_600);
    local_610 = mahjong::ScoringTable::nonDealerSelfDrawn
                          ((ScoringTable *)
                           &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,0xd,0);
    StringFrom(iVar7);
    pcVar4 = SimpleString::asCharString(&local_608);
    local_618.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_618);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,CONCAT44(iVar7,0xdb),&local_618);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1dcfe0);
    SimpleString::~SimpleString((SimpleString *)0x1dcfec);
    SimpleString::~SimpleString((SimpleString *)0x1dcff8);
  }
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerSelfDrawn_ManganOrMore)
{
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 70).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(3, 70).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 40).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(4, 40).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 70).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(4, 70).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(5, 0).first);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(5, 0).second);

	CHECK_EQUAL(3000, t.nonDealerSelfDrawn(6, 0).first);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(6, 0).second);
	CHECK_EQUAL(3000, t.nonDealerSelfDrawn(7, 0).first);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(7, 0).second);

	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(8, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(8, 0).second);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(9, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(9, 0).second);
	CHECK_EQUAL(4000, t.nonDealerSelfDrawn(10, 0).first);
	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(10, 0).second);

	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(11, 0).first);
	CHECK_EQUAL(12000, t.nonDealerSelfDrawn(11, 0).second);
	CHECK_EQUAL(6000, t.nonDealerSelfDrawn(12, 0).first);
	CHECK_EQUAL(12000, t.nonDealerSelfDrawn(12, 0).second);

	CHECK_EQUAL(8000, t.nonDealerSelfDrawn(13, 0).first);
	CHECK_EQUAL(16000, t.nonDealerSelfDrawn(13, 0).second);
}